

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O2

IterateResult __thiscall
glcts::DrawBuffersIndexedBlending::iterate(DrawBuffersIndexedBlending *this)

{
  undefined1 *this_00;
  RenderContext *pRVar1;
  code *pcVar2;
  code *pcVar3;
  TestLog *pTVar4;
  bool bVar5;
  GLint dbs;
  DrawBuffersIndexedBlending *pDVar6;
  deUint32 dVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined4 extraout_var;
  ostream *this_01;
  uint uVar13;
  GLenum GVar14;
  ConstPixelBufferAccess *access;
  GLenum GVar15;
  void *__buf;
  char *description;
  int i_1;
  qpTestResult testResult;
  IterateResult IVar16;
  GLenum GVar17;
  TextureFormat this_02;
  uint uVar18;
  DrawBuffersIndexedBlending *pDVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int i;
  float fVar23;
  float fVar24;
  GLint maxDrawBuffers;
  allocator<char> local_411;
  DrawBuffersIndexedBlending *local_410;
  allocator<char> local_405;
  undefined4 local_404;
  GLuint tex;
  RGBA local_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  ulong local_3e8;
  long local_3e0;
  RGBA expected [4];
  TextureLevel textureLevel;
  string local_3a0;
  string local_380;
  ConstPixelBufferAccess local_360;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  BlendMaskStateMachine state;
  string local_2c8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  ShaderProgram program;
  ostringstream os;
  long lVar12;
  
  iVar9 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar9);
  uVar10 = iterate::BlendFormats[iterate::formatId];
  prepareFramebuffer(this);
  maxDrawBuffers = 0;
  (**(code **)(lVar12 + 0x868))(0x8824,&maxDrawBuffers);
  if (maxDrawBuffers < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
    return STOP;
  }
  GVar17 = 1;
  local_410 = this;
  (**(code **)(lVar12 + 0x6f8))(1,&tex);
  (**(code **)(lVar12 + 0xb8))(0x8c1a,tex);
  pDVar19 = (DrawBuffersIndexedBlending *)0x8c1a;
  (**(code **)(lVar12 + 0x1398))(0x8c1a,1,(ulong)uVar10,0x20,0x20,maxDrawBuffers);
  for (iVar9 = 0; iVar9 < maxDrawBuffers; iVar9 = iVar9 + 1) {
    pDVar19 = (DrawBuffersIndexedBlending *)0x8d40;
    (**(code **)(lVar12 + 0x6b8))(0x8d40,iVar9 + 0x8ce0,tex,0,iVar9);
  }
  local_3f8 = 0.5;
  fStack_3f4 = 0.5;
  fStack_3f0 = 0.5;
  fStack_3ec = 0.5;
  local_3e8 = (ulong)uVar10;
  for (iVar9 = 0; dbs = maxDrawBuffers, iVar9 < maxDrawBuffers; iVar9 = iVar9 + 1) {
    pDVar19 = (DrawBuffersIndexedBlending *)0x1800;
    (**(code **)(lVar12 + 0x1a8))(0x1800,iVar9,&local_3f8);
  }
  local_338 = 0x3e6147ae3f5c28f6;
  uStack_330 = 0x3ee666663e9eb852;
  local_328 = 0x3f547ae13df5c28f;
  uStack_320 = 0x3ed70a3d3eae147b;
  local_318 = 0x3f2147ae3f0f5c29;
  uStack_310 = 0x3f7d70a43f428f5c;
  local_308 = 0x3eae147b3e0f5c29;
  uStack_300 = 0x3e6147ae3eae147b;
  uVar10 = NumComponents(pDVar19,(GLenum)local_3e8);
  uVar13 = 0;
  bVar5 = false;
  uVar20 = 0;
  uVar22 = 0;
  bVar8 = false;
  uVar21 = 0xff000000;
  if (1 < uVar10) {
    uVar22 = 0x3800;
    if (uVar10 == 2) {
      uVar20 = 0;
      bVar8 = false;
    }
    else {
      if (uVar10 == 4) {
        uVar21 = (int)(long)(fStack_3ec * 255.0) << 0x18;
        uVar20 = 0x4f0000;
        bVar5 = true;
        bVar8 = true;
        goto LAB_00ccfe48;
      }
      bVar8 = true;
      uVar20 = 0x4f0000;
    }
    bVar5 = false;
    uVar21 = 0xff000000;
  }
LAB_00ccfe48:
  uVar18 = (uint)(long)(local_3f8 * 255.0);
  expected[0].m_value = uVar20 | uVar22 | uVar21 | uVar18;
  uVar22 = (int)(long)(fStack_3f4 * 255.0) << 8;
  uVar20 = (int)(long)(fStack_3f0 * 255.0) << 0x10;
  if (uVar10 < 2) {
    uVar22 = 0;
  }
  if (!bVar8) {
    uVar20 = 0;
  }
  uVar21 = 0x6b000000;
  if (bVar5) {
    fVar23 = 0.99;
    fVar24 = fStack_3ec;
  }
  else {
    fVar23 = 1.0;
    fVar24 = 1.0;
    uVar21 = 0xff000000;
  }
  expected[1].m_value = uVar20 | uVar18 | uVar21 | uVar22;
  if (1 < uVar10) {
    uVar13 = (int)(long)((fVar23 * 0.63 - fVar24 * fStack_3f4) * 255.0) << 8;
  }
  uVar20 = 0;
  if (bVar8) {
    uVar20 = (int)(long)((fVar23 * 0.76 - fVar24 * fStack_3f0) * 255.0) << 0x10;
  }
  uVar22 = 0xff000000;
  if (bVar5) {
    uVar22 = (int)(long)((0.98010004 - fStack_3ec * fStack_3ec) * 255.0) << 0x18;
  }
  expected[2].m_value =
       uVar13 | (uint)(long)((fVar23 * 0.56 - fVar24 * local_3f8) * 255.0) | uVar20 | uVar22;
  uVar13 = 0xff000000;
  if (bVar5) {
    uVar13 = (int)(long)((fStack_3ec + -0.22) * 255.0) << 0x18;
  }
  uVar22 = 0;
  uVar20 = (int)(long)((fStack_3f4 + -0.34) * 255.0) << 8;
  if (uVar10 < 2) {
    uVar20 = uVar22;
  }
  uVar10 = (int)(long)((fStack_3f0 + -0.34) * 255.0) << 0x10;
  if (!bVar8) {
    uVar10 = uVar22;
  }
  expected[3].m_value = uVar20 | (uint)(long)((local_3f8 + -0.14) * 255.0) | uVar10 | uVar13;
  pDVar19 = (DrawBuffersIndexedBlending *)
            (local_410->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context;
  DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
            (&state,(Context *)pDVar19,
             ((local_410->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log,dbs);
  for (; pDVar6 = local_410, (int)uVar22 < maxDrawBuffers; uVar22 = uVar22 + 1) {
    GVar15 = GVar17;
    GVar14 = GVar17;
    switch(uVar22 & 3) {
    case 0:
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei(&state,uVar22);
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparatei
                (&state,uVar22,0x8007,0x8008);
      break;
    case 1:
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei(&state,uVar22);
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi(&state,uVar22,0x8006);
      pDVar19 = (DrawBuffersIndexedBlending *)(ulong)uVar22;
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei(&state,uVar22,0,1,1,0);
      goto LAB_00cd00e4;
    case 2:
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei(&state,uVar22);
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi(&state,uVar22,0x800a);
      GVar14 = 0x304;
      GVar15 = 0x302;
      break;
    case 3:
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei(&state,uVar22);
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi(&state,uVar22,0x800b);
    }
    pDVar19 = (DrawBuffersIndexedBlending *)(ulong)uVar22;
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunci(&state,uVar22,GVar15,GVar14);
LAB_00cd00e4:
  }
  pRVar1 = ((local_410->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx;
  GenVS_abi_cxx11_((string *)&textureLevel,pDVar19);
  this_02 = textureLevel.m_format;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,(char *)textureLevel.m_format,(allocator<char> *)&local_380);
  GenFS_abi_cxx11_(&local_3a0,(DrawBuffersIndexedBlending *)this_02,maxDrawBuffers);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,local_3a0._M_dataplus._M_p,&local_411);
  glu::makeVtxFragSources((ProgramSources *)&os,&local_2c8,(string *)&local_360);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)&os);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&os);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&textureLevel);
  if (program.m_program.m_info.linkOk == false) {
    IVar16 = STOP;
    tcu::TestContext::setTestResult
              ((pDVar6->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Could not create shader program");
  }
  else {
    (**(code **)(lVar12 + 0x1680))(program.m_program.m_program);
    uVar11 = (**(code **)(lVar12 + 0x780))(program.m_program.m_program,"position");
    local_2c8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
    local_2c8._M_string_length = 0x3f80000000000000;
    local_2c8.field_2._M_allocated_capacity = 0xbf800000;
    local_2c8.field_2._8_8_ = 0x3f800000bf800000;
    local_2a8 = 0x3f80000000000000;
    uStack_2a0 = 0x3f800000;
    local_298 = 0x3f800000bf800000;
    uStack_290 = 0x3f80000000000000;
    local_288 = 0xbf800000;
    (**(code **)(lVar12 + 0x19f0))(uVar11,3,0x1406,0,0);
    (**(code **)(lVar12 + 0x610))(uVar11);
    for (uVar10 = 0; (int)uVar10 < maxDrawBuffers; uVar10 = uVar10 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      this_01 = std::operator<<((ostream *)&os,"c");
      std::ostream::operator<<(this_01,uVar10);
      dVar7 = program.m_program.m_program;
      pcVar2 = *(code **)(lVar12 + 0x15a8);
      pcVar3 = *(code **)(lVar12 + 0xb48);
      std::__cxx11::stringbuf::str();
      uVar11 = (*pcVar3)(dVar7,textureLevel.m_format);
      (*pcVar2)(uVar11,1,(long)&local_338 + (ulong)((uVar10 & 3) << 4));
      std::__cxx11::string::~string((string *)&textureLevel);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    }
    (**(code **)(lVar12 + 0x538))(4,0,6);
    local_3fc = GetEpsilon(local_410);
    local_404 = (undefined4)CONCAT71((uint7)(uint3)(local_3fc.m_value >> 8),1);
    this_00 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    local_3e0 = lVar12;
    for (uVar10 = 0; lVar12 = local_3e0, (int)uVar10 < maxDrawBuffers; uVar10 = uVar10 + 1) {
      (**(code **)(local_3e0 + 0x1218))(uVar10 + 0x8ce0);
      os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x300000008;
      tcu::TextureLevel::TextureLevel(&textureLevel,(TextureFormat *)&os,0x20,0x20,1);
      pRVar1 = ((local_410->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx
      ;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&os,&textureLevel);
      glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)&os);
      bVar8 = VerifyImg(local_410,&textureLevel,(RGBA)expected[uVar10 & 3].m_value,local_3fc);
      if (!bVar8) {
        os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             ((local_410->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"Blending error in texture format ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," occurred for draw buffer #");
        std::ostream::operator<<(this_00,uVar10);
        std::operator<<((ostream *)this_00,"\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&os,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        pTVar4 = ((local_410->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Result",&local_411)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"Rendered result image",&local_405);
        access = &local_360;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)access,&textureLevel);
        tcu::LogImage::LogImage
                  ((LogImage *)&os,&local_3a0,&local_380,access,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&os,(int)pTVar4,__buf,(size_t)access);
        tcu::LogImage::~LogImage((LogImage *)&os);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        local_404 = 0;
      }
      tcu::TextureLevel::~TextureLevel(&textureLevel);
    }
    (**(code **)(local_3e0 + 0x4e8))(0xbe2);
    pDVar19 = local_410;
    (**(code **)(lVar12 + 0x1680))(0);
    (**(code **)(lVar12 + 0xb8))(0x8c1a,0);
    testResult = QP_TEST_RESULT_FAIL;
    (**(code **)(lVar12 + 0x480))(1,&tex);
    releaseFramebuffer(pDVar19);
    iVar9 = (**(code **)(lVar12 + 0x800))();
    description = "Some functions generated error";
    if (iVar9 == 0) {
      description = "Blending error occurred";
    }
    if (((byte)local_404 & iVar9 == 0) != 0) {
      iterate::formatId = iterate::formatId + 1;
      if (iterate::formatId < 6) {
        IVar16 = CONTINUE;
        goto LAB_00cd0598;
      }
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    tcu::TestContext::setTestResult
              ((pDVar19->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
               super_TestNode.m_testCtx,testResult,description);
    iterate::formatId = 0;
    IVar16 = STOP;
  }
LAB_00cd0598:
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  _Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
  ::~_Vector_base((_Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                   *)&state);
  return IVar16;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedBlending::iterate()
{
	static const glw::GLenum BlendFormats[] = {
		GL_R8, GL_RG8, GL_RGB8, GL_RGB565, GL_RGBA4, GL_RGBA8,
	};
	static const int	kSize	= 32;
	static unsigned int formatId = 0;

	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLenum			  format = BlendFormats[formatId];

	prepareFramebuffer();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	// Prepare render targets
	glw::GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, tex);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, format, kSize, kSize, maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, tex, 0, i);
	}

	// Clear background color
	tcu::Vec4 background(0.5f, 0.5f, 0.5f, 0.5f);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.clearBufferfv(GL_COLOR, i, &background[0]);
	}

	// Prepare expected, blended color values
	tcu::Vec4 colors[] = { tcu::Vec4(0.86f, 0.22f, 0.31f, 0.45f), tcu::Vec4(0.12f, 0.83f, 0.34f, 0.42f),
						   tcu::Vec4(0.56f, 0.63f, 0.76f, 0.99f), tcu::Vec4(0.14f, 0.34f, 0.34f, 0.22f) };

	int		  numComponents = NumComponents(format);
	tcu::RGBA expected[]	= {
		// GL_MIN
		tcu::RGBA(static_cast<unsigned int>(background.x() * 255),
				  static_cast<unsigned int>((numComponents >= 2 ? colors[0].y() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents >= 3 ? colors[0].z() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents == 4 ? background.w() : 1.0f) * 255)),
		// GL_FUNC_ADD
		tcu::RGBA(static_cast<unsigned int>(background.x() * 255),
				  static_cast<unsigned int>((numComponents >= 2 ? background.y() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents >= 3 ? background.z() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents == 4 ? colors[1].w() : 1.0f) * 255)),
		// GL_FUNC_SUBTRACT
		tcu::RGBA(
			static_cast<unsigned int>((colors[2].x() * (numComponents == 4 ? colors[2].w() : 1.0f) -
									   background.x() * (numComponents == 4 ? background.w() : 1.0f)) *
									  255),
			static_cast<unsigned int>((numComponents >= 2 ?
										   (colors[2].y() * (numComponents == 4 ? colors[2].w() : 1.0f) -
											background.y() * (numComponents == 4 ? background.w() : 1.0f)) :
										   0.0f) *
									  255),
			static_cast<unsigned int>((numComponents >= 3 ?
										   (colors[2].z() * (numComponents == 4 ? colors[2].w() : 1.0f) -
											background.z() * (numComponents == 4 ? background.w() : 1.0f)) :
										   0.0f) *
									  255),
			static_cast<unsigned int>(
				(numComponents == 4 ? (colors[2].w() * colors[2].w() - background.w() * background.w()) : 1.0f) * 255)),
		// GL_FUNC_REVERSE_SUBTRACT
		tcu::RGBA(static_cast<unsigned int>((background.x() - colors[3].x()) * 255),
				  static_cast<unsigned int>((numComponents >= 2 ? (background.y() - colors[3].y()) : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents >= 3 ? (background.z() - colors[3].z()) : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents == 4 ? (background.w() - colors[3].w()) : 1.0f) * 255))
	};

	// Setup blending operations
	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		switch (i % 4)
		{
		case 0:
			// GL_MIN
			state.SetEnablei(i);
			state.SetBlendEquationSeparatei(i, GL_MIN, GL_MAX);
			state.SetBlendFunci(i, GL_ONE, GL_ONE);
			break;
		case 1:
			// GL_FUNC_ADD
			state.SetEnablei(i);
			state.SetBlendEquationi(i, GL_FUNC_ADD);
			state.SetBlendFuncSeparatei(i, GL_ZERO, GL_ONE, GL_ONE, GL_ZERO);
			break;
		case 2:
			// GL_FUNC_SUBTRACT
			state.SetEnablei(i);
			state.SetBlendEquationi(i, GL_FUNC_SUBTRACT);
			state.SetBlendFunci(i, GL_SRC_ALPHA, GL_DST_ALPHA);
			break;
		case 3:
			// GL_FUNC_REVERSE_SUBTRACT
			state.SetEnablei(i);
			state.SetBlendEquationi(i, GL_FUNC_REVERSE_SUBTRACT);
			state.SetBlendFunci(i, GL_ONE, GL_ONE);
			break;
		}
	}

	// Prepare shader programs and draw fullscreen quad
	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(GenVS().c_str(), GenFS(maxDrawBuffers).c_str()));
	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Could not create shader program");
		return STOP;
	}
	gl.useProgram(program.getProgram());

	glw::GLuint positionLocation = gl.getAttribLocation(program.getProgram(), "position");
	tcu::Vec3   vertices[]		 = {
		tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f, 1.0f, 0.0f),
		tcu::Vec3(1.0f, 1.0f, 0.0f),   tcu::Vec3(-1.0f, 1.0f, 0.0f), tcu::Vec3(1.0f, -1.0f, 0.0f)
	};

	gl.vertexAttribPointer(positionLocation, 3, GL_FLOAT, GL_FALSE, 0, vertices);
	gl.enableVertexAttribArray(positionLocation);

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		std::ostringstream os;
		os << "c" << i;
		// i.e.: glUniform4fv(glGetUniformLocation(m_program, "c0"), 1, &colors[i].r);
		gl.uniform4fv(gl.getUniformLocation(program.getProgram(), os.str().c_str()), 1, &colors[i % 4][0]);
	}

	gl.drawArrays(GL_TRIANGLES, 0, 6);

	// Read buffer colors and validate proper blending behaviour
	bool	  success = true;
	tcu::RGBA epsilon = GetEpsilon();
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);

		tcu::TextureLevel textureLevel(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									   kSize, kSize);
		glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

		if (!VerifyImg(textureLevel, expected[i % 4], epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Blending error in texture format " << format
							   << " occurred for draw buffer #" << i << "\n"
							   << tcu::TestLog::EndMessage;
			m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
			success = false;
		}
	}

	gl.disable(GL_BLEND);
	gl.useProgram(0);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.deleteTextures(1, &tex);
	releaseFramebuffer();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		formatId = 0;
		return STOP;
	}

	if (!success)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Blending error occurred");
		formatId = 0;
		return STOP;
	}
	else
	{
		++formatId;
		if (formatId < (sizeof(BlendFormats) / sizeof(BlendFormats[0])))
		{
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			formatId = 0;
			return STOP;
		}
	}
}